

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsc_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_message(limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
                   *this,type_index *msg_type,message_ref_t *message,uint overlimit_reaction_deep)

{
  anon_class_32_4_1988f3e1 l;
  deliver_op_tracer tracer;
  deliver_op_tracer local_21;
  deliver_op_tracer *local_20;
  limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *plStack_18;
  type_index *ptStack_10;
  message_ref_t *pmStack_8;
  
  local_20 = &local_21;
  l.this = this;
  l.tracer = local_20;
  l.msg_type = msg_type;
  l.message = message;
  plStack_18 = this;
  ptStack_10 = msg_type;
  pmStack_8 = message;
  do_delivery<so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::do_deliver_message(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
            (this,local_20,l);
  return;
}

Assistant:

virtual void
		do_deliver_message(
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const override
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as TRACING_BASE
						*this, // as abstract_message_box_t
						"deliver_message",
						msg_type, message, overlimit_reaction_deep };

				this->do_delivery( tracer, [&] {
					tracer.push_to_queue( m_single_consumer );

					agent_t::call_push_event(
							*m_single_consumer,
							message_limit::control_block_t::none(),
							m_id,
							msg_type,
							message );
				} );
			}